

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcePack.cpp
# Opt level: O2

void __thiscall ResourcePack::load_mesh(ResourcePack *this,string *name)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  string terr;
  string warn;
  vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_> materials;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  string mesh_file_path;
  attrib_t attrib;
  Mesh mesh;
  ostringstream mesh_file_path_stream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&mesh_file_path_stream);
  poVar2 = std::operator<<((ostream *)&mesh_file_path_stream,"../res/");
  poVar2 = std::operator<<(poVar2,(string *)name);
  std::operator<<(poVar2,".obj");
  std::__cxx11::stringbuf::str();
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  terr._M_dataplus._M_p = (pointer)&terr.field_2;
  terr._M_string_length = 0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  terr.field_2._M_local_buf[0] = '\0';
  bVar1 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&terr,mesh_file_path._M_dataplus._M_p,
                           (char *)0x0,true,true);
  if (warn._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&warn);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (terr._M_string_length != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&terr);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  if (bVar1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar2);
    Mesh::Mesh(&mesh,&attrib.vertices,&attrib.normals,&attrib.texcoords,&attrib.colors);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Mesh>_>_>
              ::operator[](&this->meshes,name);
    Mesh::operator=(this_00,&mesh);
    poVar2 = std::operator<<((ostream *)&std::cout,"mesh loaded");
    std::endl<char,std::char_traits<char>>(poVar2);
    Mesh::~Mesh(&mesh);
    std::__cxx11::string::~string((string *)&terr);
    std::__cxx11::string::~string((string *)&warn);
    std::vector<tinyobj::_material_t,_std::allocator<tinyobj::_material_t>_>::~vector(&materials);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    tinyobj::attrib_t::~attrib_t(&attrib);
    std::__cxx11::string::~string((string *)&mesh_file_path);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mesh_file_path_stream);
    return;
  }
  exit(1);
}

Assistant:

void ResourcePack::load_mesh(std::string& name) {
    std::ostringstream mesh_file_path_stream;
    mesh_file_path_stream << "../res/" << name << ".obj";
    std::string mesh_file_path = mesh_file_path_stream.str();
 
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string terr;

    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &terr, mesh_file_path.c_str());

    if (!warn.empty()) {
        std::cout << warn << std::endl;
    }

    if (!terr.empty()) {
        std::cerr << terr << std::endl;
    }

    if (!ret) {
        exit(1);
    }

    std::cout << attrib.vertices.size() << std::endl;
    Mesh mesh(attrib.vertices, attrib.normals, attrib.texcoords, attrib.colors);
    meshes[name] = mesh;

    std::cout << "mesh loaded" << std::endl;
}